

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  doh_probes *pdVar1;
  DOHcode DVar2;
  CURLcode CVar3;
  uchar *doh;
  size_t dohlen;
  char *pcVar4;
  char *pcVar5;
  Curl_addrinfo *local_2c8;
  Curl_addrinfo *ai;
  Curl_dns_entry *dns;
  doh_probe *p;
  undefined1 local_2a8 [4];
  int slot;
  dohentry de;
  DOHcode rc [2];
  doh_probes *dohp;
  CURLcode result;
  Curl_dns_entry **dnsp_local;
  Curl_easy *data_local;
  
  pdVar1 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar1 == (doh_probes *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar1->probe[0].easy_mid < 0) && (pdVar1->probe[1].easy_mid < 0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if (((ulong)data->conn->bits >> 4 & 1) != 0) {
      data_local._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else if (pdVar1->pending == 0) {
    memset(&de.numcname,0,8);
    Curl_doh_close(data);
    de_init((dohentry *)local_2a8);
    for (p._4_4_ = 0; p._4_4_ < 2; p._4_4_ = p._4_4_ + 1) {
      dns = (Curl_dns_entry *)(pdVar1->probe + p._4_4_);
      if (*(DNStype *)&dns->timestamp != 0) {
        doh = Curl_dyn_uptr((dynbuf *)&dns[0x10].hostport);
        dohlen = Curl_dyn_len((dynbuf *)&dns[0x10].hostport);
        DVar2 = doh_resp_decode(doh,dohlen,(DNStype)dns->timestamp,(dohentry *)local_2a8);
        rc[(long)p._4_4_ + -2] = DVar2;
        Curl_dyn_free((dynbuf *)&dns[0x10].hostport);
        if ((((rc[(long)p._4_4_ + -2] != DOH_OK) && (data != (Curl_easy *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
           (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))
        {
          pcVar4 = doh_strerror(rc[(long)p._4_4_ + -2]);
          pcVar5 = doh_type2name((DNStype)dns->timestamp);
          Curl_infof(data,"DoH: %s type %s for %s",pcVar4,pcVar5,pdVar1->host);
        }
      }
    }
    dohp._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if ((de.numcname == 0) || (de._620_4_ == 0)) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_doh_trc.log_level)))) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"[DoH] hostname: %s",pdVar1->host);
        }
        doh_show(data,(dohentry *)local_2a8);
      }
      CVar3 = doh2ai((dohentry *)local_2a8,pdVar1->host,pdVar1->port,&local_2c8);
      if (CVar3 != CURLE_OK) {
        de_cleanup((dohentry *)local_2a8);
        return CVar3;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      ai = (Curl_addrinfo *)Curl_cache_addr(data,local_2c8,pdVar1->host,0,pdVar1->port,false);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (ai == (Curl_addrinfo *)0x0) {
        Curl_freeaddrinfo(local_2c8);
        dohp._4_4_ = CURLE_OK;
      }
      else {
        (data->state).async.dns = (Curl_dns_entry *)ai;
        *dnsp = (Curl_dns_entry *)ai;
        dohp._4_4_ = CURLE_OK;
      }
    }
    de_cleanup((dohentry *)local_2a8);
    Curl_doh_cleanup(data);
    data_local._4_4_ = dohp._4_4_;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe[DOH_SLOT_IPV4].easy_mid < 0 &&
     dohp->probe[DOH_SLOT_IPV6].easy_mid < 0) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_probe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->resp_body),
                                 Curl_dyn_len(&p->resp_body),
                                 p->dnstype, &de);
      Curl_dyn_free(&p->resp_body);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_doh_trc)) {
        infof(data, "[DoH] hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port, FALSE);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */
#ifdef USE_HTTPSRR
    if(de.numhttps_rrs > 0 && result == CURLE_OK && *dnsp) {
      struct Curl_https_rrinfo *hrr = NULL;
      result = doh_resp_decode_httpsrr(de.https_rrs->val, de.https_rrs->len,
                                       &hrr);
      if(result) {
        infof(data, "Failed to decode HTTPS RR");
        return result;
      }
      infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
      doh_print_httpsrr(data, hrr);
# endif
      (*dnsp)->hinfo = hrr;
    }
#endif

    /* All done */
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}